

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void simd::ProjectionProfile
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,bool horizontal,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *projection,SIMDType simdType)

{
  byte bVar1;
  uint32_t rowSize;
  uint32_t *out;
  uint32_t *puVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint local_40;
  
  bVar1 = image->_colorCount;
  do {
    if (simdType == cpu_function) break;
    uVar3 = getSimdSize(simdType);
    if (uVar3 <= height * width * (uint)bVar1) {
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (image,x,y,width,height);
      local_40 = (uint)bVar1;
      uVar5 = width * local_40;
      uVar6 = height;
      if (horizontal) {
        uVar6 = uVar5;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(projection,(ulong)uVar6);
      puVar2 = (projection->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      out = (projection->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
      for (puVar4 = out; puVar4 != puVar2; puVar4 = puVar4 + 1) {
        *puVar4 = 0;
      }
      rowSize = image->_rowSize;
      uVar6 = uVar5 / uVar3;
      if (simdType == sse_function) {
        sse::ProjectionProfile
                  (rowSize,image->_data + (ulong)(local_40 * x) + (ulong)(y * rowSize),height,
                   horizontal,out,uVar6,uVar3 * uVar6,uVar5 % uVar3);
      }
      else if (simdType == avx_function) {
        avx::ProjectionProfile
                  (rowSize,image->_data + (ulong)(local_40 * x) + (ulong)(y * rowSize),height,
                   horizontal,out,uVar6,uVar3 * uVar6,uVar5 % uVar3);
      }
      return;
    }
    bVar7 = simdType == avx_function;
    simdType = sse_function;
  } while (bVar7);
  Image_Function::ProjectionProfile(image,x,y,width,height,horizontal,projection);
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                            std::vector < uint32_t > & projection, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );
        const uint8_t colorCount = image.colorCount();

        if( (simdType == cpu_function) || ((width * height * colorCount) < simdSize) ) {
            AVX_CODE( ProjectionProfile( image, x, y, width, height, horizontal, projection, sse_function ); )

            Image_Function::ProjectionProfile( image, x, y, width, height, horizontal, projection );
            return;
        }
        Image_Function::ParameterValidation( image, x, y, width, height );
        width = width * colorCount;

        projection.resize( horizontal ? width : height );
        std::fill( projection.begin(), projection.end(), 0u );
        uint32_t * out = projection.data();

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageStart = image.data() + y * rowSize + x * colorCount; 

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::ProjectionProfile( rowSize, imageStart, height, horizontal, out, simdWidth, totalSimdWidth, nonSimdWidth ) )
        SSE_CODE( sse::ProjectionProfile( rowSize, imageStart, height, horizontal, out, simdWidth, totalSimdWidth, nonSimdWidth ) )
        NEON_CODE( neon::ProjectionProfile( rowSize, imageStart, height, horizontal, out, simdWidth, totalSimdWidth, nonSimdWidth ) )
    }